

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  char *pcVar1;
  IRRef1 IVar2;
  uint uVar3;
  IRIns *pIVar4;
  bool bVar5;
  ushort uVar6;
  uint nmax;
  uint uVar7;
  uint ref_00;
  TRef TVar8;
  TRef TVar9;
  TRef TVar10;
  SnapShot *pSVar11;
  SnapEntry *map_00;
  IRIns *pIVar12;
  IRIns *pIVar13;
  IRIns *pIVar14;
  IRIns *ir_00;
  bool local_1a9;
  IRIns *irc;
  IRIns *irf;
  IRIns *irk;
  ushort local_188;
  TRef tmp;
  TRef key;
  TRef val;
  IRIns *irr;
  IRIns *pIStack_170;
  TRef tr_1;
  IRIns *irs_1;
  TRef op2;
  TRef op1;
  IRIns *ir_2;
  IRRef refp_1;
  SnapEntry sn_2;
  IRIns *irs;
  IRIns *ir_1;
  IRRef refp;
  SnapEntry sn_1;
  IRIns *irlast;
  uint32_t mode;
  IRType t;
  TRef tr;
  IRIns *ir;
  IRRef ref;
  BCReg s;
  SnapEntry sn;
  int pass23;
  BloomFilter seen;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  GCtrace *T_local;
  jit_State *J_local;
  uint local_2c;
  uint local_c;
  
  pSVar11 = T->snap + J->exitno;
  map_00 = T->snapmap + pSVar11->mapofs;
  nmax = (uint)pSVar11->nent;
  _sn = 0;
  bVar5 = false;
  J->framedepth = 0;
  for (seen._4_4_ = 0; seen._4_4_ < nmax; seen._4_4_ = seen._4_4_ + 1) {
    uVar3 = map_00[seen._4_4_];
    uVar7 = uVar3 >> 0x18;
    ref_00 = uVar3 & 0xffff;
    pIVar12 = T->ir + ref_00;
    if (((_sn & 1L << ((byte)ref_00 & 0x3f)) == 0) ||
       (mode = snap_dedup(J,map_00,seen._4_4_,ref_00), mode == 0)) {
      _sn = 1L << ((byte)ref_00 & 0x3f) | _sn;
      if (ref_00 < 0x8000) {
        if (uVar3 == 0x1057fff) {
          mode = 0;
        }
        else {
          mode = snap_replay_const(J,pIVar12);
        }
      }
      else if (((pIVar12->field_0).prev & 0xff80) == 0x80) {
        bVar5 = true;
        mode = uVar7;
      }
      else {
        uVar6 = 0x21;
        if ((pIVar12->field_1).o == 'G') {
          uVar6 = (pIVar12->field_0).op2 & 0x10 | 0x21;
        }
        if ((uVar3 & 0x100000) != 0) {
          uVar6 = uVar6 | 0x40;
        }
        (J->fold).ins.field_0.ot = (pIVar12->field_1).t.irt & 0x1f | 0x4700;
        *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar3 >> 0x18);
        (J->fold).ins.field_0.op2 = uVar6;
        mode = lj_ir_emit(J);
      }
    }
    J->slot[uVar7] = mode | uVar3 & 0x130000;
    local_1a9 = (uVar3 & 0x30000) != 0 && uVar7 != 1;
    J->framedepth = (uint)local_1a9 + J->framedepth;
    if ((uVar3 & 0x10000) != 0) {
      J->baseslot = uVar7 + 1;
    }
  }
  if (bVar5) {
    pIVar12 = T->ir;
    uVar6 = pSVar11->ref;
    bVar5 = false;
    for (seen._4_4_ = 0; seen._4_4_ < nmax; seen._4_4_ = seen._4_4_ + 1) {
      uVar3 = map_00[seen._4_4_];
      pIVar13 = T->ir + (uVar3 & 0xffff);
      if ((pIVar13->field_1).r == 0xfd) {
        if (J->slot[uVar3 >> 0x18] == uVar3 >> 0x18) {
          bVar5 = true;
          if (T->nk <= (uint)(pIVar13->field_0).op1) {
            snap_pref(J,T,map_00,nmax,_sn,(uint)(pIVar13->field_0).op1);
          }
          if (T->nk <= (uint)(pIVar13->field_0).op2) {
            snap_pref(J,T,map_00,nmax,_sn,(uint)(pIVar13->field_0).op2);
          }
          _refp_1 = pIVar13;
          if ((pIVar13->field_1).o != 'T') {
            while (pIVar4 = _refp_1, _refp_1 = pIVar4 + 1, _refp_1 < pIVar12 + uVar6) {
              if (*(char *)((long)pIVar4 + 0xe) == -2) {
                if (*(char *)((long)pIVar4 + 0xf) == -1) {
                  local_c = snap_sunk_store2(T,pIVar13,_refp_1);
                }
                else {
                  local_c = (uint)(pIVar13 + (int)(uint)*(byte *)((long)pIVar4 + 0xf) == _refp_1);
                }
                if ((local_c != 0) &&
                   (TVar8 = snap_pref(J,T,map_00,nmax,_sn,(uint)*(ushort *)((long)pIVar4 + 10)),
                   TVar8 == 0)) {
                  snap_pref(J,T,map_00,nmax,_sn,
                            (uint)T->ir[*(ushort *)((long)pIVar4 + 10)].field_0.op1);
                }
              }
            }
          }
        }
      }
      else if ((0x7fff < (uVar3 & 0xffff)) && (((pIVar13->field_0).prev & 0xff80) == 0x80)) {
        TVar8 = snap_pref(J,T,map_00,nmax,_sn,(uint)(pIVar13->field_0).op1);
        J->slot[uVar3 >> 0x18] = TVar8;
      }
    }
    for (seen._4_4_ = 0; bVar5 && seen._4_4_ < nmax; seen._4_4_ = seen._4_4_ + 1) {
      uVar3 = map_00[seen._4_4_];
      pIVar13 = T->ir + (uVar3 & 0xffff);
      if ((pIVar13->field_1).r == 0xfd) {
        if (J->slot[uVar3 >> 0x18] == uVar3 >> 0x18) {
          irs_1._4_2_ = (pIVar13->field_0).op1;
          if (T->nk <= (uint)irs_1._4_2_) {
            TVar8 = snap_pref(J,T,map_00,nmax,_sn,(uint)irs_1._4_2_);
            irs_1._4_2_ = (ushort)TVar8;
          }
          irs_1._0_2_ = (pIVar13->field_0).op2;
          if (T->nk <= (uint)(ushort)irs_1) {
            TVar8 = snap_pref(J,T,map_00,nmax,_sn,(uint)(ushort)irs_1);
            irs_1._0_2_ = (ushort)TVar8;
          }
          if ((pIVar13->field_1).o == 'T') {
            (J->fold).ins.field_0.ot = (pIVar13->field_0).ot & 0xff9f;
            (J->fold).ins.field_0.op1 = irs_1._4_2_;
            (J->fold).ins.field_0.op2 = (ushort)irs_1;
            TVar8 = lj_opt_fold(J);
            J->slot[uVar3 >> 0x18] = TVar8;
          }
          else {
            (J->fold).ins.field_0.ot = (pIVar13->field_0).ot;
            (J->fold).ins.field_0.op1 = irs_1._4_2_;
            (J->fold).ins.field_0.op2 = (ushort)irs_1;
            TVar8 = lj_opt_fold(J);
            J->slot[uVar3 >> 0x18] = TVar8;
            pIVar4 = pIVar13;
            while (pIStack_170 = pIVar4 + 1, pIStack_170 < pIVar12 + uVar6) {
              if (*(char *)((long)pIVar4 + 0xe) == -2) {
                if (*(char *)((long)pIVar4 + 0xf) == -1) {
                  local_2c = snap_sunk_store2(T,pIVar13,pIStack_170);
                }
                else {
                  local_2c = (uint)(pIVar13 + (int)(uint)*(byte *)((long)pIVar4 + 0xf) ==
                                   pIStack_170);
                }
                if (local_2c == 0) goto LAB_001a1184;
                pIVar14 = T->ir + (pIStack_170->field_0).op1;
                local_188 = (pIVar14->field_0).op2;
                irk._4_4_ = TVar8;
                if ((pIVar14->field_1).o != '>') {
                  ir_00 = T->ir + local_188;
                  if ((pIVar14->field_1).o == '9') {
                    TVar9 = snap_replay_const(J,T->ir + (ir_00->field_0).op1);
                    TVar9 = lj_ir_kslot(J,TVar9,(uint)(ir_00->field_0).op2);
                    local_188 = (ushort)TVar9;
                  }
                  else {
                    TVar9 = snap_replay_const(J,ir_00);
                    local_188 = (ushort)TVar9;
                  }
                  if (((pIVar14->field_1).o == '9') || ((pIVar14->field_1).o == '8')) {
                    IVar2 = (&T->ir->field_0)[(pIVar14->field_0).op1].op2;
                    (J->fold).ins.field_0.ot = (&T->ir->field_0)[(pIVar14->field_0).op1].ot;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                    (J->fold).ins.field_0.op2 = IVar2;
                    irk._4_4_ = lj_opt_fold(J);
                  }
                }
                (J->fold).ins.field_0.ot = (pIVar14->field_0).ot;
                (J->fold).ins.field_0.op1 = (IRRef1)irk._4_4_;
                (J->fold).ins.field_0.op2 = local_188;
                TVar9 = lj_opt_fold(J);
                tmp = snap_pref(J,T,map_00,nmax,_sn,(uint)*(ushort *)((long)pIVar4 + 10));
                if (tmp == 0) {
                  TVar10 = snap_pref(J,T,map_00,nmax,_sn,
                                     (uint)T->ir[*(ushort *)((long)pIVar4 + 10)].field_0.op1);
                  (J->fold).ins.field_0.ot = 0x5b0e;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
                  (J->fold).ins.field_0.op2 = 0x1d3;
                  tmp = lj_opt_fold(J);
                }
                (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar4 + 0xc);
                (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)tmp;
                lj_opt_fold(J);
                pIVar4 = pIStack_170;
              }
              else {
LAB_001a1184:
                pcVar1 = (char *)((long)pIVar4 + 0xd);
                pIVar4 = pIStack_170;
                if ((*pcVar1 == 'Z') && ((pIVar13->field_1).o == 'S')) {
                  (J->fold).ins.field_0.ot = 0x5a00;
                  (J->fold).ins.field_0.op1 = 0;
                  (J->fold).ins.field_0.op2 = 0;
                  lj_opt_fold(J);
                }
              }
            }
          }
        }
        else {
          J->slot[uVar3 >> 0x18] = J->slot[J->slot[uVar3 >> 0x18]];
        }
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar11->nslots - J->baseslot;
  lj_snap_add(J);
  if (bVar5) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_0.op1 = 0;
    (J->fold).ins.field_0.op2 = 0;
    lj_ir_emit(J);
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      if ((sn & SNAP_KEYINDEX)) mode |= IRSLOAD_KEYINDEX;
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    /* Same as TREF_* flags. */
    J->slot[s] = tr | (sn&(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME));
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	if (ir->op1 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op1);
	if (ir->op2 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	if (op1 >= T->nk) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (op2 >= T->nk) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}